

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_rotate(lua_State *L,int idx,int n)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  TValue *from;
  StkId to;
  StkId pTVar4;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xd6,"void lua_rotate(lua_State *, int, int)");
  }
  pTVar4 = L->top;
  from = index2addr(L,idx);
  if ((idx < -0xf4627) || (from == &luaO_nilobject_)) {
    __assert_fail("((((p) != (&luaO_nilobject_)) && !((idx) <= (-1000000 - 1000)))) && \"index not in the stack\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xd9,"void lua_rotate(lua_State *, int, int)");
  }
  pTVar4 = pTVar4 + -1;
  uVar3 = -n;
  if (0 < n) {
    uVar3 = n;
  }
  if (((long)pTVar4 - (long)from >> 4) + 1 < (long)(ulong)uVar3) {
    __assert_fail("((n >= 0 ? n : -n) <= (t - p + 1)) && \"invalid \'n\'\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xda,"void lua_rotate(lua_State *, int, int)");
  }
  if (n < 0) {
    to = from + (-1 - (long)n);
  }
  else {
    to = pTVar4 + -(ulong)(uint)n;
  }
  reverse(L,from,to);
  reverse(L,to + 1,pTVar4);
  reverse(L,from,pTVar4);
  piVar2 = *(int **)&L[-1].hookmask;
  *piVar2 = *piVar2 + -1;
  if (*piVar2 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0xdf,"void lua_rotate(lua_State *, int, int)");
}

Assistant:

LUA_API void lua_rotate (lua_State *L, int idx, int n) {
  StkId p, t, m;
  lua_lock(L);
  t = L->top - 1;  /* end of stack segment being rotated */
  p = index2addr(L, idx);  /* start of segment */
  api_checkstackindex(L, idx, p);
  api_check(L, (n >= 0 ? n : -n) <= (t - p + 1), "invalid 'n'");
  m = (n >= 0 ? t - n : p - n - 1);  /* end of prefix */
  reverse(L, p, m);  /* reverse the prefix with length 'n' */
  reverse(L, m + 1, t);  /* reverse the suffix */
  reverse(L, p, t);  /* reverse the entire segment */
  lua_unlock(L);
}